

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.h
# Opt level: O0

_Bool prune_palette_testing_inter(AV1_COMP *cpi,uint source_variance)

{
  _Bool local_f;
  _Bool local_e;
  _Bool local_d;
  uint source_variance_local;
  AV1_COMP *cpi_local;
  
  local_d = false;
  if ((((cpi->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN) &&
      (local_d = false, 10 < (cpi->oxcf).speed)) &&
     (local_d = false, (cpi->rc).high_source_sad != 0)) {
    local_e = true;
    if ((cpi->sf).rt_sf.prune_palette_search_nonrd < 3) {
      local_f = false;
      if ((((cpi->sf).rt_sf.rc_compute_spatial_var_sc != 0) &&
          (local_f = false, (cpi->rc).frame_spatial_variance < 0x4b0)) &&
         ((local_f = false, (cpi->rc).perc_spatial_flat_blocks < 5 &&
          (local_f = false, 0x62 < (cpi->rc).percent_blocks_with_motion)))) {
        local_f = source_variance < 4000;
      }
      local_e = local_f;
    }
    local_d = local_e;
  }
  return local_d;
}

Assistant:

static inline bool prune_palette_testing_inter(AV1_COMP *cpi,
                                               unsigned int source_variance) {
  return (
      cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN &&
      cpi->oxcf.speed >= 11 && cpi->rc.high_source_sad &&
      ((cpi->sf.rt_sf.prune_palette_search_nonrd > 2) ||
       (cpi->sf.rt_sf.rc_compute_spatial_var_sc &&
        cpi->rc.frame_spatial_variance < 1200 &&
        cpi->rc.perc_spatial_flat_blocks < 5 &&
        cpi->rc.percent_blocks_with_motion > 98 && source_variance < 4000)));
}